

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

wchar_t skip(archive_read *a)

{
  void *pvVar1;
  mtree *mtree;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  if (-1 < *(int *)((long)pvVar1 + 0x30)) {
    close(*(int *)((long)pvVar1 + 0x30));
    *(undefined4 *)((long)pvVar1 + 0x30) = 0xffffffff;
  }
  return L'\0';
}

Assistant:

static int
skip(struct archive_read *a)
{
	struct mtree *mtree;

	mtree = (struct mtree *)(a->format->data);
	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}
	return (ARCHIVE_OK);
}